

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,VariableExpression *expression)

{
  int index_00;
  Value *pVVar1;
  string local_60;
  Symbol local_40;
  int local_1c;
  VariableExpression *pVStack_18;
  int index;
  VariableExpression *expression_local;
  NewFunctionProcessingVisitor *this_local;
  
  pVStack_18 = expression;
  expression_local = (VariableExpression *)this;
  std::__cxx11::string::string((string *)&local_60,(string *)&expression->variable_name_);
  Symbol::Symbol(&local_40,&local_60);
  index_00 = FunctionTable::Get(&this->table_,&local_40);
  Symbol::~Symbol(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  local_1c = index_00;
  pVVar1 = FrameEmulator::Get(&this->frame_,index_00);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = pVVar1;
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(VariableExpression* expression) {
  int index = table_.Get(Symbol(expression->variable_name_));
  tos_value_ = frame_.Get(index);
}